

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O2

void __thiscall
license::CryptoHelperLinux::loadPrivateKey(CryptoHelperLinux *this,string *privateKey)

{
  BIO *bp;
  EVP_PKEY *pEVar1;
  logic_error *this_00;
  EVP_PKEY **x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  x = &this->m_pktmp;
  if ((EVP_PKEY *)this->m_pktmp != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)this->m_pktmp);
  }
  *x = (EVP_PKEY *)0x0;
  bp = BIO_new_mem_buf((privateKey->_M_dataplus)._M_p,(int)privateKey->_M_string_length);
  pEVar1 = PEM_read_bio_PrivateKey(bp,(EVP_PKEY **)x,(undefined1 *)0x0,(void *)0x0);
  *x = (EVP_PKEY *)pEVar1;
  if (pEVar1 != (EVP_PKEY *)0x0) {
    BIO_free(bp);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Private key [",privateKey);
  std::operator+(&local_40,&local_60,"] can\'t be loaded");
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CryptoHelperLinux::loadPrivateKey(const std::string &privateKey) {
	if (m_pktmp) {
		EVP_PKEY_free(m_pktmp);
	}

	m_pktmp = nullptr;
	BIO *bio = BIO_new_mem_buf((void *)(privateKey.c_str()), privateKey.size());
	m_pktmp = PEM_read_bio_PrivateKey(bio, &m_pktmp, NULL, NULL);
	if (!m_pktmp) {
		throw logic_error("Private key [" + privateKey + "] can't be loaded");
	}
	BIO_free(bio);
}